

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printAssociativeContainer<QHash<QString,QVariant>>
                 (QDebug *debug,char *which,QHash<QString,_QVariant> *c)

{
  long lVar1;
  bool bVar2;
  QVariant *variant;
  QDebug *in_RCX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff5f;
  const_iterator *in_stack_ffffffffffffff60;
  QString *in_stack_ffffffffffffff68;
  const_iterator *in_stack_ffffffffffffff70;
  Stream *pSVar3;
  QDebug *in_stack_ffffffffffffff98;
  QDebug *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = in_RDI;
  t = in_RSI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)in_RDI,(QDebug *)in_RDI);
  QDebug::nospace(in_RSI);
  variant = (QVariant *)QDebug::operator<<(in_RSI,(char *)t);
  QDebug::operator<<(in_RSI,(char *)t);
  QHash<QString,_QVariant>::constBegin((QHash<QString,_QVariant> *)in_RDI);
  while( true ) {
    QHash<QString,_QVariant>::constEnd((QHash<QString,_QVariant> *)in_stack_ffffffffffffff68);
    bVar2 = QHash<QString,_QVariant>::const_iterator::operator!=
                      ((const_iterator *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (!bVar2) break;
    in_stack_ffffffffffffff70 =
         (const_iterator *)
         QDebug::operator<<((QDebug *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
    QHash<QString,_QVariant>::const_iterator::key((const_iterator *)0x3e0faf);
    in_stack_ffffffffffffff68 =
         (QString *)
         QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff60 = (const_iterator *)QDebug::operator<<(in_RSI,(char *)t);
    QHash<QString,_QVariant>::const_iterator::value((const_iterator *)0x3e0fe8);
    ::operator<<(in_stack_ffffffffffffff98,variant);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
    QDebug::~QDebug(in_RCX);
    QHash<QString,_QVariant>::const_iterator::operator++(in_stack_ffffffffffffff70);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
  QDebug::QDebug((QDebug *)in_stack_ffffffffffffff70,(QDebug *)in_stack_ffffffffffffff68);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)pSVar3;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}